

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_add_impl(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,_Bool inplace)

{
  bool bVar1;
  _Bool _Var2;
  ggml_tensor *src;
  ggml_tensor *pgVar3;
  
  _Var2 = ggml_are_same_shape(a,b);
  if (!_Var2) {
    fprintf(_stderr,"GGML_ASSERT: %s:%d: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/antimatter15[P]alpaca/ggml.c",0xbec,
            "ggml_are_same_shape(a, b)");
    abort();
  }
  if (inplace) {
    src = ggml_view_tensor(ctx,a);
    src->op = GGML_OP_ADD;
  }
  else {
    if ((a->grad == (ggml_tensor *)0x0) && (b->grad == (ggml_tensor *)0x0)) {
      bVar1 = false;
    }
    else {
      bVar1 = true;
    }
    src = ggml_dup_tensor(ctx,a);
    src->op = GGML_OP_ADD;
    if (bVar1) {
      pgVar3 = ggml_dup_tensor(ctx,src);
      goto LAB_00118afd;
    }
  }
  pgVar3 = (ggml_tensor *)0x0;
LAB_00118afd:
  src->grad = pgVar3;
  src->src0 = a;
  src->src1 = b;
  return src;
}

Assistant:

struct ggml_tensor * ggml_add_impl(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        struct ggml_tensor * b,
        bool inplace) {
    GGML_ASSERT(ggml_are_same_shape(a, b));

    bool is_node = false;

    if (!inplace && (a->grad || b->grad)) {
        is_node = true;
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_ADD;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = b;

    return result;
}